

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

void __thiscall
Units_scalingFactorIncompatibleUnitsNoChecking_Test::
~Units_scalingFactorIncompatibleUnitsNoChecking_Test
          (Units_scalingFactorIncompatibleUnitsNoChecking_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, scalingFactorIncompatibleUnitsNoChecking)
{
    // This test shows that a scaling factor can be returned for incompatible units
    // when compatibility checking is turned off.

    auto model = libcellml::Model::create("st_clements");
    auto lemons = libcellml::Units::create("lemons");
    lemons->addUnit("metre", "kilo");
    auto oranges = libcellml::Units::create("oranges");
    oranges->addUnit("second", "milli");
    model->addUnits(oranges);
    model->addUnits(lemons);

    EXPECT_EQ(1.0E+6, libcellml::Units::scalingFactor(oranges, lemons, false));
}